

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

SVInt __thiscall slang::SVInt::reverse(SVInt *this)

{
  bool bVar1;
  uint32_t uVar2;
  uint amount;
  SVInt *pSVar3;
  SVInt *this_00;
  uint64_t uVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  SVInt *in_RSI;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 in_RDI;
  SVInt SVar6;
  bitwidth_t msw;
  uint32_t i_1;
  uint32_t i;
  uint64_t *src;
  uint64_t *dst;
  uint32_t words;
  SVInt result;
  uint64_t r;
  undefined1 in_stack_ffffffffffffff5f;
  SVInt *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  SVInt *in_stack_ffffffffffffff70;
  SVInt *other;
  undefined4 in_stack_ffffffffffffff80;
  uint32_t uVar7;
  uint in_stack_ffffffffffffffa8;
  uint uVar8;
  
  bVar1 = isSingleWord(in_RSI);
  if (bVar1) {
    reverseBits64((uint64_t)in_stack_ffffffffffffff60);
    SVInt(in_stack_ffffffffffffff70,(bitwidth_t)((ulong)in_stack_ffffffffffffff68 >> 0x20),
          (uint64_t)in_stack_ffffffffffffff60,(bool)in_stack_ffffffffffffff5f);
    uVar5 = extraout_RDX;
  }
  else {
    allocUninitialized((bitwidth_t)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                       SUB81((ulong)in_stack_ffffffffffffff68 >> 0x18,0),
                       SUB81((ulong)in_stack_ffffffffffffff68 >> 0x10,0));
    uVar2 = getNumWords((in_RSI->super_SVIntStorage).bitWidth,false);
    uVar7 = uVar2;
    pSVar3 = (SVInt *)getRawData(in_stack_ffffffffffffff60);
    other = pSVar3;
    this_00 = (SVInt *)getRawData(in_stack_ffffffffffffff60);
    for (uVar8 = 0; uVar8 < uVar2; uVar8 = uVar8 + 1) {
      uVar4 = reverseBits64((uint64_t)in_stack_ffffffffffffff60);
      (&(pSVar3->super_SVIntStorage).field_0)[uVar8].val = uVar4;
    }
    if (((in_RSI->super_SVIntStorage).unknownFlag & 1U) != 0) {
      for (in_stack_ffffffffffffffa8 = 0; in_stack_ffffffffffffffa8 < uVar2;
          in_stack_ffffffffffffffa8 = in_stack_ffffffffffffffa8 + 1) {
        in_stack_ffffffffffffff60 = (SVInt *)reverseBits64((uint64_t)in_stack_ffffffffffffff60);
        (&(pSVar3->super_SVIntStorage).field_0)[(ulong)uVar2 + (ulong)in_stack_ffffffffffffffa8].val
             = (uint64_t)in_stack_ffffffffffffff60;
      }
    }
    amount = (in_RSI->super_SVIntStorage).bitWidth & 0x3f;
    if (amount == 0) {
      SVInt((SVInt *)CONCAT44(uVar7,in_stack_ffffffffffffff80),other);
    }
    else {
      lshr((SVInt *)CONCAT44(uVar8,in_stack_ffffffffffffffa8),amount);
    }
    ~SVInt(this_00);
    uVar5 = extraout_RDX_00;
  }
  SVar6.super_SVIntStorage.bitWidth = (int)uVar5;
  SVar6.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar5 >> 0x20);
  SVar6.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar5 >> 0x28);
  SVar6.super_SVIntStorage._14_2_ = (short)((ulong)uVar5 >> 0x30);
  SVar6.super_SVIntStorage.field_0.val = in_RDI.val;
  return (SVInt)SVar6.super_SVIntStorage;
}

Assistant:

SVInt SVInt::reverse() const {
    if (isSingleWord()) {
        uint64_t r = reverseBits64(val) >> (BITS_PER_WORD - bitWidth);
        return SVInt(bitWidth, r, signFlag);
    }

    auto result = SVInt::allocUninitialized(bitWidth, signFlag, unknownFlag);
    uint32_t words = getNumWords(bitWidth, false);
    uint64_t* dst = result.getRawData();
    const uint64_t* src = getRawData();

    for (uint32_t i = 0; i < words; i++)
        dst[i] = reverseBits64(src[words - i - 1]);

    if (unknownFlag) {
        dst += words;
        src += words;
        for (uint32_t i = 0; i < words; i++)
            dst[i] = reverseBits64(src[words - i - 1]);
    }

    // If we aren't aligned to a multiple of 64 bits, we need to shift
    // the result back down because we reversed some bits that weren't
    // actually included in the number.
    bitwidth_t msw = bitWidth % BITS_PER_WORD;
    if (msw != 0)
        return result.lshr(BITS_PER_WORD - msw);

    return result;
}